

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiPlayerDialog.cpp
# Opt level: O0

void __thiscall MidiPlayerDialog::on_saveListButton_clicked(MidiPlayerDialog *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  Master *this_00;
  QSettings *pQVar5;
  QListWidgetItem *this_01;
  QTextStream *s;
  QString local_138;
  int local_11c;
  QTextStream local_118 [4];
  int i;
  QTextStream listStream;
  QFlags<QIODeviceBase::OpenModeFlag> local_104;
  QFile local_100 [8];
  QFile listFile;
  QDir local_f0 [8];
  QString local_e8;
  Int local_cc;
  QString local_c8;
  QString local_b0;
  undefined1 local_98 [8];
  QString fileName;
  QString local_60;
  QVariant local_48;
  QFlag local_24;
  QFlags<QFileDialog::Option> local_20 [2];
  Options qFileDialogOptions;
  MidiPlayerDialog *this_local;
  
  if ((on_saveListButton_clicked()::currentDir == '\0') &&
     (iVar3 = __cxa_guard_acquire(&on_saveListButton_clicked()::currentDir), iVar3 != 0)) {
    QString::QString(&on_saveListButton_clicked::currentDir,(char *)0x0);
    __cxa_atexit(QString::~QString,&on_saveListButton_clicked::currentDir,&__dso_handle);
    __cxa_guard_release(&on_saveListButton_clicked()::currentDir);
  }
  this_00 = Master::getInstance();
  pQVar5 = Master::getSettings(this_00);
  QString::QString(&local_60,"Master/qFileDialogOptions");
  QVariant::QVariant((QVariant *)&fileName.d.size,0);
  QSettings::value((QString *)&local_48,(QVariant *)pQVar5);
  iVar3 = QVariant::toInt((bool *)&local_48);
  QFlag::QFlag(&local_24,iVar3);
  QFlags<QFileDialog::Option>::QFlags(local_20,local_24);
  QVariant::~QVariant(&local_48);
  QVariant::~QVariant((QVariant *)&fileName.d.size);
  QString::~QString(&local_60);
  QString::QString(&local_b0,(char *)0x0);
  QString::QString(&local_c8,"Play list files (*.*)");
  local_cc = local_20[0].i;
  QFileDialog::getSaveFileName
            ((QWidget *)local_98,(QString *)this,(QString *)&local_b0,
             (QString *)&on_saveListButton_clicked::currentDir,(QString *)&local_c8,
             (QFlags_conflict1 *)0x0);
  QString::~QString(&local_c8);
  QString::~QString(&local_b0);
  bVar1 = QString::isEmpty((QString *)local_98);
  if (!bVar1) {
    QDir::QDir(local_f0,(QString *)local_98);
    QDir::absolutePath();
    QString::operator=(&on_saveListButton_clicked::currentDir,&local_e8);
    QString::~QString(&local_e8);
    QDir::~QDir(local_f0);
    QFile::QFile(local_100,(QString *)local_98);
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags(&local_104,WriteOnly);
    bVar2 = QFile::open((QFlags_conflict1 *)local_100);
    if ((bVar2 & 1) != 0) {
      QTextStream::QTextStream(local_118,(QIODevice *)local_100);
      for (local_11c = 0; iVar3 = local_11c, iVar4 = QListWidget::count(), iVar3 < iVar4;
          local_11c = local_11c + 1) {
        this_01 = (QListWidgetItem *)QListWidget::item((int)*(undefined8 *)(this->ui + 0x18));
        QListWidgetItem::text(&local_138,this_01);
        s = (QTextStream *)QTextStream::operator<<(local_118,(QString *)&local_138);
        ::operator<<(s,Qt::endl);
        QString::~QString(&local_138);
      }
      QTextStream::~QTextStream(local_118);
    }
    QFile::~QFile(local_100);
  }
  QString::~QString((QString *)local_98);
  return;
}

Assistant:

void MidiPlayerDialog::on_saveListButton_clicked() {
	static QString currentDir = NULL;
	QFileDialog::Options qFileDialogOptions = QFileDialog::Options(Master::getInstance()->getSettings()->value("Master/qFileDialogOptions", 0).toInt());
	QString fileName = QFileDialog::getSaveFileName(this, NULL, currentDir, "Play list files (*.*)",
		NULL, qFileDialogOptions);
	if (!fileName.isEmpty()) {
		currentDir = QDir(fileName).absolutePath();
		QFile listFile(fileName);
		if (!listFile.open(QIODevice::WriteOnly)) return;
		QTextStream listStream(&listFile);
		for (int i = 0; i < ui->playList->count(); i++) {
#if QT_VERSION >= QT_VERSION_CHECK(5, 15, 0)
			using Qt::endl;
#endif
			listStream << ui->playList->item(i)->text() << endl;
		}
	}
}